

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunLegalizeBitcasts(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  VmInstruction *pVVar1;
  SynBase *source;
  VmInstruction *original;
  VmFunction *pVVar2;
  TypeBase *type;
  VmConstant *address;
  TypeBase *type_00;
  VmValue *pVVar3;
  VmBlock *value_00;
  
  if ((value == (VmValue *)0x0) || (pVVar2 = (VmFunction *)value, value->typeID != 4)) {
    pVVar2 = (VmFunction *)0x0;
  }
  if (pVVar2 == (VmFunction *)0x0) {
    if ((value == (VmValue *)0x0) || (value->typeID != 3)) {
      value = (VmValue *)0x0;
    }
    if ((VmBlock *)value != (VmBlock *)0x0) {
      module->currentBlock = (VmBlock *)value;
      pVVar1 = ((VmBlock *)value)->firstInstruction;
joined_r0x001ab51b:
      original = pVVar1;
      if (original != (VmInstruction *)0x0) {
        pVVar1 = original->nextSibling;
        if (original->cmd == VM_INST_BITCAST) {
          if ((original->arguments).count != 0) {
            if ((((*(original->arguments).data)->type).type != VM_TYPE_STRUCT) ||
               ((original->super_VmValue).type.type != VM_TYPE_DOUBLE)) goto joined_r0x001ab51b;
            type = GetBaseType(ctx,(original->super_VmValue).type);
            address = anon_unknown.dwarf_10d873::CreateAlloca
                                (ctx,module,(original->super_VmValue).source,type,"reg",true);
            ((VmBlock *)value)->insertPoint = original;
            if ((original->arguments).count != 0) {
              source = (original->super_VmValue).source;
              type_00 = GetBaseType(ctx,(*(original->arguments).data)->type);
              if ((original->arguments).count != 0) {
                pVVar3 = *(original->arguments).data;
                anon_unknown.dwarf_10d873::CreateStore
                          (ctx,module,source,type_00,&address->super_VmValue,pVVar3,0);
                pVVar3 = anon_unknown.dwarf_10d873::CreateLoad
                                   (ctx,module,(original->super_VmValue).source,type,
                                    &address->super_VmValue,(uint)pVVar3);
                ((VmBlock *)value)->insertPoint = ((VmBlock *)value)->lastInstruction;
                anon_unknown.dwarf_10d873::ReplaceValueUsersWith
                          (module,&original->super_VmValue,pVVar3,(uint *)0x0);
                goto joined_r0x001ab51b;
              }
            }
          }
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                       );
        }
        goto joined_r0x001ab51b;
      }
    }
  }
  else {
    module->currentFunction = pVVar2;
    for (value_00 = pVVar2->firstBlock; value_00 != (VmBlock *)0x0; value_00 = value_00->nextSibling
        ) {
      RunLegalizeBitcasts(ctx,module,&value_00->super_VmValue);
    }
    module->currentFunction = (VmFunction *)0x0;
  }
  return;
}

Assistant:

void RunLegalizeBitcasts(ExpressionContext &ctx, VmModule *module, VmValue* value)
{
	if(VmFunction *function = getType<VmFunction>(value))
	{
		module->currentFunction = function;

		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
			RunLegalizeBitcasts(ctx, module, curr);

		module->currentFunction = NULL;
	}
	else if(VmBlock *block = getType<VmBlock>(value))
	{
		module->currentBlock = block;

		for(VmInstruction *curr = block->firstInstruction; curr;)
		{
			VmInstruction *next = curr->nextSibling;

			if(curr->cmd == VM_INST_BITCAST)
			{
				if(curr->arguments[0]->type.type == VM_TYPE_STRUCT && curr->type.type == VM_TYPE_DOUBLE)
				{
					TypeBase *type = GetBaseType(ctx, curr->type);

					VmConstant *address = CreateAlloca(ctx, module, curr->source, type, "reg", true);

					block->insertPoint = curr;

					CreateStore(ctx, module, curr->source, GetBaseType(ctx, curr->arguments[0]->type), address, curr->arguments[0], 0);
					VmValue *loadInst = CreateLoad(ctx, module, curr->source, type, address, 0);

					block->insertPoint = block->lastInstruction;

					ReplaceValueUsersWith(module, curr, loadInst, NULL);
				}
			}

			curr = next;
		}
	}
}